

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::inputsAvailable(llbuild::core::TaskInterface_
          (void *this,TaskInterface ti)

{
  pointer *ppuVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  ValueType local_50;
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  ppuVar1 = &local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value-B","");
  llbuild::core::TaskInterface::discoveredDependency(&local_30,(KeyType *)&local_50);
  if ((pointer *)
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  iVar2 = *(int *)((long)this + 0x10) * **(int **)((long)this + 8) * 5;
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 4;
  *local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = (uchar)iVar2;
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar2 >> 8);
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar2 >> 0x10);
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (uchar)((uint)iVar2 >> 0x18);
  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  llbuild::core::TaskInterface::complete(&local_30,&local_50,false);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      // Report the discovered dependency.
      ti.discoveredDependency("value-B");
      ti.complete(intToValue(computedInputValue * valueB * 5));
    }